

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItem::stackBefore(QGraphicsItem *this,QGraphicsItem *sibling)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  QGraphicsItemPrivate *pQVar4;
  QGraphicsItem *pQVar5;
  QGraphicsItem **ppQVar6;
  QGraphicsItem *pQVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  QList<QGraphicsItem_*> *this_00;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (sibling != this) {
    if (sibling != (QGraphicsItem *)0x0) {
      pQVar4 = (this->d_ptr).d;
      pQVar5 = pQVar4->parent;
      if (pQVar5 == ((sibling->d_ptr).d)->parent) {
        lVar10 = 0x98;
        pQVar7 = pQVar5;
        if (pQVar5 == (QGraphicsItem *)0x0) {
          pQVar7 = (QGraphicsItem *)pQVar4->scene;
          lVar10 = 0x148;
          if (pQVar7 != (QGraphicsItem *)0x0) goto LAB_005ec067;
          this_00 = (QList<QGraphicsItem_*> *)0x0;
        }
        else {
LAB_005ec067:
          this_00 = (QList<QGraphicsItem_*> *)
                    ((long)&((pQVar7->d_ptr).d)->_vptr_QGraphicsItemPrivate + lVar10);
        }
        if (this_00 != (QList<QGraphicsItem_*> *)0x0) {
          if (pQVar5 == (QGraphicsItem *)0x0) {
            QGraphicsScenePrivate::ensureSequentialTopLevelSiblingIndexes
                      (*(QGraphicsScenePrivate **)&pQVar4->scene->field_0x8);
          }
          else {
            QGraphicsItemPrivate::ensureSequentialSiblingIndex((pQVar5->d_ptr).d);
          }
          uVar1 = ((sibling->d_ptr).d)->siblingIndex;
          iVar2 = ((this->d_ptr).d)->siblingIndex;
          if ((int)uVar1 <= iVar2) {
            QList<QGraphicsItem_*>::move(this_00,(long)iVar2,(long)(int)uVar1);
            uVar9 = (this_00->d).size;
            if (uVar9 != 0) {
              ppQVar6 = (this_00->d).ptr;
              uVar8 = 0;
              do {
                if (uVar1 != uVar8) {
                  pQVar4 = (ppQVar6[uVar8]->d_ptr).d;
                  iVar3 = pQVar4->siblingIndex;
                  if (((int)uVar1 <= iVar3) && (iVar3 <= iVar2)) {
                    pQVar4->siblingIndex = iVar3 + 1;
                  }
                }
                uVar8 = uVar8 + 1;
              } while (uVar9 != uVar8);
            }
            ((this->d_ptr).d)->siblingIndex = uVar1;
            if ((this_00->d).size != 0) {
              uVar9 = 0;
              do {
                if (uVar1 != uVar9) {
                  pQVar4 = ((this_00->d).ptr[uVar9]->d_ptr).d;
                  iVar3 = pQVar4->siblingIndex;
                  if (((int)uVar1 <= iVar3) && (iVar3 <= iVar2)) {
                    (*pQVar4->_vptr_QGraphicsItemPrivate[10])();
                  }
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < (ulong)(this_00->d).size);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
              (*((this->d_ptr).d)->_vptr_QGraphicsItemPrivate[10])();
              return;
            }
            goto LAB_005ec1c7;
          }
          goto LAB_005ec1a1;
        }
      }
    }
    local_50[0] = '\x02';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    local_50[8] = '\0';
    local_50[9] = '\0';
    local_50[10] = '\0';
    local_50[0xb] = '\0';
    local_50[0xc] = '\0';
    local_50[0xd] = '\0';
    local_50[0xe] = '\0';
    local_50[0xf] = '\0';
    local_50[0x10] = '\0';
    local_50[0x11] = '\0';
    local_50[0x12] = '\0';
    local_50[0x13] = '\0';
    local_50[0x14] = '\0';
    local_50[0x15] = '\0';
    local_50[0x16] = '\0';
    local_50[0x17] = '\0';
    local_38 = "default";
    QMessageLogger::warning
              (local_50,"QGraphicsItem::stackUnder: cannot stack under %p, which must be a sibling",
               sibling);
  }
LAB_005ec1a1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_005ec1c7:
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::stackBefore(const QGraphicsItem *sibling)
{
    if (sibling == this)
        return;
    if (!sibling || d_ptr->parent != sibling->parentItem()) {
        qWarning("QGraphicsItem::stackUnder: cannot stack under %p, which must be a sibling", sibling);
        return;
    }
    QList<QGraphicsItem *> *siblings = d_ptr->parent
                                       ? &d_ptr->parent->d_ptr->children
                                       : (d_ptr->scene ? &d_ptr->scene->d_func()->topLevelItems : nullptr);
    if (!siblings) {
        qWarning("QGraphicsItem::stackUnder: cannot stack under %p, which must be a sibling", sibling);
        return;
    }

    // First, make sure that the sibling indexes have no holes. This also
    // marks the children list for sorting.
    if (d_ptr->parent)
        d_ptr->parent->d_ptr->ensureSequentialSiblingIndex();
    else
        d_ptr->scene->d_func()->ensureSequentialTopLevelSiblingIndexes();

    // Only move items with the same Z value, and that need moving.
    int siblingIndex = sibling->d_ptr->siblingIndex;
    int myIndex = d_ptr->siblingIndex;
    if (myIndex >= siblingIndex) {
        siblings->move(myIndex, siblingIndex);
        // Fixup the insertion ordering.
        for (int i = 0; i < siblings->size(); ++i) {
            int &index = siblings->at(i)->d_ptr->siblingIndex;
            if (i != siblingIndex && index >= siblingIndex && index <= myIndex)
                ++index;
        }
        d_ptr->siblingIndex = siblingIndex;
        for (int i = 0; i < siblings->size(); ++i) {
            int &index = siblings->at(i)->d_ptr->siblingIndex;
            if (i != siblingIndex && index >= siblingIndex && index <= myIndex)
                siblings->at(i)->d_ptr->siblingOrderChange();
        }
        d_ptr->siblingOrderChange();
    }
}